

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

Action * __thiscall EOPlus::Parser::ParseAction(Action *__return_storage_ptr__,Parser *this)

{
  undefined1 local_d0 [80];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  deque<util::variant,_std::allocator<util::variant>_> local_60;
  
  Action::Action(__return_storage_ptr__);
  __return_storage_ptr__->cond = None;
  ParseExpression((Expression *)local_d0,this);
  std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::_M_move_assign1
            (&(__return_storage_ptr__->expr).scopes,local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->expr).function,(string *)&local_80);
  std::deque<util::variant,_std::allocator<util::variant>_>::_M_move_assign1
            (&(__return_storage_ptr__->expr).args,&local_60);
  std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
  }
  std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
            ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

Action Parser::ParseAction()
	{
		Action action;
		action.cond = Action::None;
		action.expr = this->ParseExpression();
		return action;
	}